

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

Point2f __thiscall pbrt::SphericalMapping2D::Sphere(SphericalMapping2D *this,Point3f *p)

{
  bool bVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  Tuple2<pbrt::Point2,_float> TVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar10 [64];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 extraout_var [60];
  
  fVar7 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  fVar6 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).z;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->textureFromRender).m.m[0][1])),
                            ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[0][0]))
  ;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (this->textureFromRender).m.m[3][1])),
                           ZEXT416((uint)fVar6),ZEXT416((uint)(this->textureFromRender).m.m[3][0]));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar5),
                            ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][2]));
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar5),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  fVar7 = auVar4._0_4_ + (this->textureFromRender).m.m[3][3];
  fVar6 = auVar8._0_4_ + (this->textureFromRender).m.m[1][3];
  fVar5 = auVar12._0_4_ + (this->textureFromRender).m.m[0][3];
  fVar11 = auVar3._0_4_ + (this->textureFromRender).m.m[2][3];
  bVar1 = fVar7 == 1.0;
  fVar5 = (float)((uint)bVar1 * (int)fVar5 + (uint)!bVar1 * (int)(fVar5 / fVar7));
  fVar6 = (float)((uint)bVar1 * (int)fVar6 + (uint)!bVar1 * (int)(fVar6 / fVar7));
  fVar7 = (float)((uint)bVar1 * (int)fVar11 + (uint)!bVar1 * (int)(fVar11 / fVar7));
  auVar12 = ZEXT416((uint)(fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6));
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  fVar11 = auVar12._0_4_;
  auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar7 / fVar11)));
  uVar2 = vcmpss_avx512f(ZEXT416((uint)(fVar7 / fVar11)),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar1 = (bool)((byte)uVar2 & 1);
  fVar7 = acosf((float)((uint)bVar1 * -0x40800000 + (uint)!bVar1 * auVar12._0_4_));
  auVar10._0_4_ = atan2f(fVar6 / fVar11,fVar5 / fVar11);
  auVar10._4_60_ = extraout_var;
  uVar2 = vcmpss_avx512f(auVar10._0_16_,ZEXT816(0) << 0x40,1);
  bVar1 = (bool)((byte)uVar2 & 1);
  auVar12._4_4_ = extraout_XMM0_Db;
  auVar12._0_4_ = fVar7;
  auVar12._8_4_ = extraout_XMM0_Dc;
  auVar12._12_4_ = extraout_XMM0_Dd;
  auVar8._4_12_ = extraout_var._0_12_;
  auVar8._0_4_ = (uint)bVar1 * (int)(auVar10._0_4_ + 6.2831855) + (uint)!bVar1 * (int)auVar10._0_4_;
  auVar12 = vinsertps_avx(auVar12,auVar8,0x10);
  TVar9.x = auVar12._0_4_ * 0.31830987;
  TVar9.y = auVar12._4_4_ * 0.15915494;
  return (Point2f)TVar9;
}

Assistant:

PBRT_CPU_GPU
    Point2f Sphere(const Point3f &p) const {
        Vector3f vec = Normalize(textureFromRender(p) - Point3f(0, 0, 0));
        Float theta = SphericalTheta(vec), phi = SphericalPhi(vec);
        return {theta * InvPi, phi * Inv2Pi};
    }